

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O2

real __thiscall fasttext::DenseMatrix::l2NormRow(DenseMatrix *this,int64_t i)

{
  float fVar1;
  real *prVar2;
  EncounteredNaNError *this_00;
  int j;
  long j_00;
  double dVar3;
  
  dVar3 = 0.0;
  for (j_00 = 0; j_00 < (this->super_Matrix).n_; j_00 = j_00 + 1) {
    prVar2 = at(this,i,j_00);
    fVar1 = *prVar2;
    prVar2 = at(this,i,j_00);
    dVar3 = dVar3 + (double)(fVar1 * *prVar2);
  }
  if (!NAN(dVar3)) {
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    return (float)dVar3;
  }
  this_00 = (EncounteredNaNError *)__cxa_allocate_exception(0x10);
  EncounteredNaNError::EncounteredNaNError(this_00);
  __cxa_throw(this_00,&EncounteredNaNError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

real DenseMatrix::l2NormRow(int64_t i) const {
  auto norm = 0.0;
  for (auto j = 0; j < n_; j++) {
    norm += at(i, j) * at(i, j);
  }
  if (std::isnan(norm)) {
    throw EncounteredNaNError();
  }
  return std::sqrt(norm);
}